

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Measurements::BestCase::BestCase(BestCase *this,int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  uint i;
  uint uVar3;
  _Head_base<0UL,_Implementation1_*,_false> local_40;
  double local_38;
  
  BenchmarkBase<Measurements::BestCase>::BenchmarkBase
            (&this->super_BenchmarkBase<Measurements::BestCase>,argc,argv);
  (this->super_BenchmarkBase<Measurements::BestCase>).super_Benchmark._vptr_Benchmark =
       (_func_int **)&PTR_run_00112d18;
  (this->pv).super_allocator_base<std::allocator<unsigned_char>_>._storage = (void_pointer)0x0;
  (this->pv).super_allocator_base<std::allocator<unsigned_char>_>._end_storage = (void_pointer)0x0;
  (this->pv)._free_elem = (elem_ptr_pointer)0x0;
  (this->pv)._begin_storage = (void_pointer)0x0;
  (this->pv)._align_max = 8;
  (this->sv).
  super__Vector_base<std::unique_ptr<Interface,_std::default_delete<Interface>_>,_std::allocator<std::unique_ptr<Interface,_std::default_delete<Interface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sv).
  super__Vector_base<std::unique_ptr<Interface,_std::default_delete<Interface>_>,_std::allocator<std::unique_ptr<Interface,_std::default_delete<Interface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sv).
  super__Vector_base<std::unique_ptr<Interface,_std::default_delete<Interface>_>,_std::allocator<std::unique_ptr<Interface,_std::default_delete<Interface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->super_BenchmarkBase<Measurements::BestCase>).is_standard == false) {
    for (uVar3 = 0; uVar3 < (this->super_BenchmarkBase<Measurements::BestCase>).num_objs;
        uVar3 = uVar3 + 1) {
      uVar1 = rand();
      if ((uVar1 & 1) == 0) {
        local_40._M_head_impl = (Implementation1 *)0x3ff199999999999a;
        local_38 = 1.3;
        poly::
        vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
        ::emplace_back<Implementation2,double,double>
                  ((vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
                    *)&this->pv,(double *)&local_40,&local_38);
      }
      else {
        iVar2 = rand();
        local_40._M_head_impl._0_4_ = iVar2;
        poly::
        vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
        ::emplace_back<Implementation1,int>
                  ((vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
                    *)&this->pv,(int *)&local_40);
      }
    }
  }
  else {
    for (uVar3 = 0; uVar3 < (this->super_BenchmarkBase<Measurements::BestCase>).num_objs;
        uVar3 = uVar3 + 1) {
      uVar1 = rand();
      if ((uVar1 & 1) == 0) {
        local_40._M_head_impl = (Implementation1 *)operator_new(0x10);
        ((local_40._M_head_impl)->super_Interface)._vptr_Interface =
             (_func_int **)&PTR_doYourThing_00112c50;
        *(undefined8 *)&(local_40._M_head_impl)->_current = 0x3ff199999999999a;
        std::
        vector<std::unique_ptr<Interface,std::default_delete<Interface>>,std::allocator<std::unique_ptr<Interface,std::default_delete<Interface>>>>
        ::emplace_back<std::unique_ptr<Implementation2,std::default_delete<Implementation2>>>
                  ((vector<std::unique_ptr<Interface,std::default_delete<Interface>>,std::allocator<std::unique_ptr<Interface,std::default_delete<Interface>>>>
                    *)&this->sv,
                   (unique_ptr<Implementation2,_std::default_delete<Implementation2>_> *)&local_40);
      }
      else {
        iVar2 = rand();
        local_38 = (double)CONCAT44(local_38._4_4_,iVar2);
        std::make_unique<Implementation1,int>((int *)&local_40);
        std::
        vector<std::unique_ptr<Interface,std::default_delete<Interface>>,std::allocator<std::unique_ptr<Interface,std::default_delete<Interface>>>>
        ::emplace_back<std::unique_ptr<Implementation1,std::default_delete<Implementation1>>>
                  ((vector<std::unique_ptr<Interface,std::default_delete<Interface>>,std::allocator<std::unique_ptr<Interface,std::default_delete<Interface>>>>
                    *)&this->sv,
                   (unique_ptr<Implementation1,_std::default_delete<Implementation1>_> *)&local_40);
      }
      if (local_40._M_head_impl != (Implementation1 *)0x0) {
        (*((local_40._M_head_impl)->super_Interface)._vptr_Interface[3])();
      }
    }
  }
  return;
}

Assistant:

BestCase(int argc, char* argv[])
        : BenchmarkBase(argc, argv)
    {
        constexpr auto size = std::max(sizeof(Implementation1), sizeof(Implementation2));

        if (is_standard) {
            for (auto i = 0U; i < num_objs; ++i) {
                if (std::rand() % 2) {
                    sv.emplace_back(std::make_unique<Implementation1>(std::rand()));
                } else {
                    sv.emplace_back(std::make_unique<Implementation2>(1.1, 1.3));
                }
            }
        } else {
            for (auto i = 0U; i < num_objs; ++i) {
                static_assert(page_size > size, "this should not happen...");
                if (std::rand() % 2) {
                    pv.emplace_back<Implementation1>(std::rand());
                } else {
                    pv.emplace_back<Implementation2>(1.1, 1.3);
                }
            }
        }
    }